

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive.cpp
# Opt level: O0

void __thiscall
SerializeArchiveVectorWriter_Write1Byte_Test::SerializeArchiveVectorWriter_Write1Byte_Test
          (SerializeArchiveVectorWriter_Write1Byte_Test *this)

{
  SerializeArchiveVectorWriter_Write1Byte_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__SerializeArchiveVectorWriter_Write1Byte_Test_00231fa0;
  return;
}

Assistant:

TEST (SerializeArchiveVectorWriter, Write1Byte) {
    std::vector<std::uint8_t> bytes;
    bytes.reserve (1);

    pstore::serialize::archive::vector_writer writer (bytes);
    std::uint8_t v{251};
    writer.put (v);

    auto begin = std::begin (writer);
    auto end = std::end (writer);
    ASSERT_EQ (1, std::distance (begin, end));
    EXPECT_EQ (1U, writer.bytes_consumed ());
    EXPECT_EQ (1U, writer.bytes_produced ());
    EXPECT_EQ (v, *begin);
}